

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O0

void __thiscall
ApprovalTests::ApprovalMissingException::ApprovalMissingException
          (ApprovalMissingException *this,string *param_2,string *approved)

{
  undefined8 *in_RDI;
  string *in_stack_00000170;
  ApprovalMissingException *in_stack_00000178;
  string *in_stack_ffffffffffffffb8;
  ApprovalException *in_stack_ffffffffffffffc0;
  string local_38 [56];
  
  *in_RDI = &PTR__ApprovalMissingException_00281818;
  format(in_stack_00000178,in_stack_00000170);
  ApprovalException::ApprovalException(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ::std::__cxx11::string::~string(local_38);
  *in_RDI = &PTR__ApprovalMissingException_00281818;
  return;
}

Assistant:

ApprovalMissingException::ApprovalMissingException(const std::string&,
                                                       const std::string& approved)
        : ApprovalException(format(approved))
    {
    }